

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O1

int TvCtrlPointPrintDevice(int devnum)

{
  int iVar1;
  TvDeviceNode *pTVar2;
  char **ppcVar3;
  char *(*papcVar4) [4];
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  char spacer [15];
  
  if (devnum < 1) {
    SampleUtil_Print("Error in TvCtrlPointPrintDevice: invalid devnum = %d\n",devnum);
    iVar1 = -1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
    SampleUtil_Print("TvCtrlPointPrintDevice:\n");
    bVar9 = GlobalDeviceList == (TvDeviceNode *)0x0;
    pTVar2 = GlobalDeviceList;
    uVar8 = 0;
    if ((!bVar9) && (uVar8 = devnum, devnum != 1)) {
      uVar7 = 1;
      do {
        pTVar2 = pTVar2->next;
        bVar9 = pTVar2 == (TvDeviceNode *)0x0;
        uVar8 = uVar7;
        if (bVar9) break;
        uVar7 = uVar7 + 1;
        uVar8 = devnum;
      } while (devnum != uVar7);
    }
    if (bVar9) {
      SampleUtil_Print("Error in TvCtrlPointPrintDevice: invalid devnum = %d  --  actual device count = %d\n"
                       ,devnum,(ulong)uVar8);
    }
    else {
      SampleUtil_Print("  TvDevice -- %d\n    |                  \n    +- UDN        = %s\n    +- DescDocURL     = %s\n    +- FriendlyName   = %s\n    +- PresURL        = %s\n    +- Adver. TimeOut = %d\n"
                       ,devnum,pTVar2,(pTVar2->device).DescDocURL,(pTVar2->device).FriendlyName,
                       (pTVar2->device).PresURL,(ulong)(uint)(pTVar2->device).AdvrTimeOut);
      ppcVar3 = (pTVar2->device).TvService[0].VariableStrVal;
      papcVar4 = TvVarName;
      lVar6 = 0;
      do {
        if (lVar6 == 0) {
          spacer[0] = ' ';
          spacer[1] = ' ';
          spacer[2] = ' ';
          spacer[3] = ' ';
          spacer[4] = '|';
          spacer[5] = ' ';
          spacer[6] = ' ';
          spacer[7] = ' ';
        }
        else {
          spacer[0] = ' ';
          spacer[1] = ' ';
          spacer[2] = ' ';
          spacer[3] = ' ';
          spacer[4] = ' ';
          spacer[5] = ' ';
          spacer[6] = ' ';
          spacer[7] = ' ';
        }
        spacer[8] = ' ';
        spacer[9] = '\0';
        SampleUtil_Print("    |                  \n    +- Tv %s Service\n%s+- ServiceId       = %s\n%s+- ServiceType     = %s\n%s+- EventURL        = %s\n%s+- ControlURL      = %s\n%s+- SID             = %s\n%s+- ServiceStateTable\n"
                         ,TvServiceName[lVar6],spacer,(pTVar2->device).TvService + lVar6,spacer,
                         (pTVar2->device).TvService[lVar6].ServiceType,spacer,
                         (pTVar2->device).TvService[lVar6].EventURL,spacer,
                         (pTVar2->device).TvService[lVar6].ControlURL,spacer,
                         (pTVar2->device).TvService[lVar6].SID,spacer);
        if ('\0' < TvVarCount[lVar6]) {
          lVar5 = 0;
          do {
            SampleUtil_Print("%s     +- %-10s = %s\n",spacer,(*papcVar4)[lVar5],ppcVar3[lVar5]);
            lVar5 = lVar5 + 1;
          } while (lVar5 < TvVarCount[lVar6]);
        }
        ppcVar3 = ppcVar3 + 0xa4;
        papcVar4 = papcVar4 + 1;
        bVar9 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar9);
    }
    iVar1 = 0;
    SampleUtil_Print("\n");
    pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
  }
  return iVar1;
}

Assistant:

int TvCtrlPointPrintDevice(int devnum)
{
	struct TvDeviceNode *tmpdevnode;
	int i = 0, service, var;
	char spacer[15];

	if (devnum <= 0) {
		SampleUtil_Print("Error in TvCtrlPointPrintDevice: "
				 "invalid devnum = %d\n",
			devnum);
		return TV_ERROR;
	}

	ithread_mutex_lock(&DeviceListMutex);

	SampleUtil_Print("TvCtrlPointPrintDevice:\n");
	tmpdevnode = GlobalDeviceList;
	while (tmpdevnode) {
		i++;
		if (i == devnum)
			break;
		tmpdevnode = tmpdevnode->next;
	}
	if (!tmpdevnode) {
		SampleUtil_Print(
			"Error in TvCtrlPointPrintDevice: "
			"invalid devnum = %d  --  actual device count = %d\n",
			devnum,
			i);
	} else {
		SampleUtil_Print("  TvDevice -- %d\n"
				 "    |                  \n"
				 "    +- UDN        = %s\n"
				 "    +- DescDocURL     = %s\n"
				 "    +- FriendlyName   = %s\n"
				 "    +- PresURL        = %s\n"
				 "    +- Adver. TimeOut = %d\n",
			devnum,
			tmpdevnode->device.UDN,
			tmpdevnode->device.DescDocURL,
			tmpdevnode->device.FriendlyName,
			tmpdevnode->device.PresURL,
			tmpdevnode->device.AdvrTimeOut);
		for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
			if (service < TV_SERVICE_SERVCOUNT - 1)
				sprintf(spacer, "    |    ");
			else
				sprintf(spacer, "         ");
			SampleUtil_Print("    |                  \n"
					 "    +- Tv %s Service\n"
					 "%s+- ServiceId       = %s\n"
					 "%s+- ServiceType     = %s\n"
					 "%s+- EventURL        = %s\n"
					 "%s+- ControlURL      = %s\n"
					 "%s+- SID             = %s\n"
					 "%s+- ServiceStateTable\n",
				TvServiceName[service],
				spacer,
				tmpdevnode->device.TvService[service].ServiceId,
				spacer,
				tmpdevnode->device.TvService[service]
					.ServiceType,
				spacer,
				tmpdevnode->device.TvService[service].EventURL,
				spacer,
				tmpdevnode->device.TvService[service]
					.ControlURL,
				spacer,
				tmpdevnode->device.TvService[service].SID,
				spacer);
			for (var = 0; var < TvVarCount[service]; var++) {
				SampleUtil_Print("%s     +- %-10s = %s\n",
					spacer,
					TvVarName[service][var],
					tmpdevnode->device.TvService[service]
						.VariableStrVal[var]);
			}
		}
	}
	SampleUtil_Print("\n");
	ithread_mutex_unlock(&DeviceListMutex);

	return TV_SUCCESS;
}